

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles2::Functional::eval_addVecScalar_ivec3(ShaderEvalContext *c)

{
  float fVar1;
  int i;
  long lVar2;
  int i_1;
  Vector<int,_3> res;
  Vector<int,_3> res_1;
  Vector<float,_3> res_2;
  float local_24 [3];
  int local_18 [6];
  
  local_24[0] = c->in[0].m_data[2];
  local_24[1] = c->in[0].m_data[0];
  local_24[2] = c->in[0].m_data[1];
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  res.m_data[2] = 0;
  lVar2 = 0;
  do {
    res.m_data[lVar2] = (int)local_24[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  fVar1 = c->in[1].m_data[0];
  res_1.m_data[2] = 0;
  res_1.m_data[0] = 0;
  res_1.m_data[1] = 0;
  lVar2 = 0;
  do {
    res_1.m_data[lVar2] = res.m_data[lVar2] + (int)fVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  res_2.m_data[2] = 0.0;
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    res_2.m_data[lVar2] = (float)res_1.m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_18[2] = 0;
  local_18[3] = 1;
  local_18[4] = 2;
  lVar2 = 2;
  do {
    (c->color).m_data[local_18[lVar2]] = (float)res_1.m_data[lVar2 + 2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

Vector<T, 3>			swizzle		(int a, int b, int c) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); return Vector<T, 3>(m_data[a], m_data[b], m_data[c]); }